

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int inflateReset2(z_stream *strm,int32_t windowBits)

{
  internal_state *piVar1;
  int iVar2;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if (windowBits < 0) {
      if ((uint)windowBits < 0xfffffff1) {
        return -2;
      }
      iVar2 = 0;
      windowBits = -windowBits;
    }
    else {
      iVar2 = ((uint)windowBits >> 4) + 5;
      if ((uint)windowBits < 0x30) {
        windowBits = windowBits & 0xf;
      }
    }
    if (((uint)windowBits < 0x10) && ((0xff01U >> (windowBits & 0x1fU) & 1) != 0)) {
      *(int *)&piVar1->pending_out = iVar2;
      piVar1->reproducible = windowBits;
      iVar2 = inflateReset(strm);
      return iVar2;
    }
  }
  return -2;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateReset2)(PREFIX3(stream) *strm, int32_t windowBits) {
    int wrap;
    struct inflate_state *state;

    /* get the state */
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;

    /* extract wrap request from windowBits parameter */
    if (windowBits < 0) {
        wrap = 0;
        if (windowBits < -MAX_WBITS)
            return Z_STREAM_ERROR;
        windowBits = -windowBits;
    } else {
        wrap = (windowBits >> 4) + 5;
#ifdef GUNZIP
        if (windowBits < 48)
            windowBits &= MAX_WBITS;
#endif
    }

    /* set number of window bits */
    if (windowBits && (windowBits < MIN_WBITS || windowBits > MAX_WBITS))
        return Z_STREAM_ERROR;

    /* update state and reset the rest of it */
    state->wrap = wrap;
    state->wbits = (unsigned)windowBits;
    return PREFIX(inflateReset)(strm);
}